

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

void Aig_TableProfile(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  
  printf("Table size = %d. Entries = %d.\n",(ulong)(uint)p->nTableSize,
         (ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
  iVar1 = p->nTableSize;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)(p->pTable + lVar4);
      iVar3 = -1;
      do {
        pAVar2 = *(Aig_Obj_t **)&pAVar2->field_0;
        iVar3 = iVar3 + 1;
      } while (pAVar2 != (Aig_Obj_t *)0x0);
      if (iVar3 != 0) {
        printf("%d ");
        iVar1 = p->nTableSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

void Aig_TableProfile( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter;
    printf( "Table size = %d. Entries = %d.\n", p->nTableSize, Aig_ManNodeNum(p) );
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}